

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_bspline_row_tec(REF_INT degree,REF_INT n_control_point,REF_DBL *knots,char *filename)

{
  double dVar1;
  double dVar2;
  REF_STATUS RVar3;
  FILE *__s;
  REF_DBL *N;
  undefined8 uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  double t;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar6 = "unable to open file";
    uVar4 = 0x10d2;
  }
  else {
    fwrite("title=\"refine bspine basis\"\n",0x1c,1,__s);
    fwrite("variables = \"t\"",0xf,1,__s);
    if (0 < n_control_point) {
      uVar7 = 0;
      do {
        fprintf(__s," \"N%d,%d\"",uVar7,(ulong)(uint)degree);
        uVar5 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar5;
      } while (n_control_point != uVar5);
    }
    fputc(10,__s);
    fprintf(__s,"zone t=\"basis\", i=%d, datapacking=%s\n",0x3e9,"point");
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10dc
             ,"ref_geom_bspline_row_tec","malloc N of REF_DBL negative");
      return 1;
    }
    N = (REF_DBL *)malloc((ulong)(uint)n_control_point * 8);
    if (N != (REF_DBL *)0x0) {
      dVar1 = knots[degree];
      dVar2 = knots[(long)(n_control_point + degree) + -1];
      iVar8 = 0;
      do {
        t = ((double)iVar8 / 1000.0) * dVar2 + (1.0 - (double)iVar8 / 1000.0) * dVar1;
        fprintf(__s," %f",t);
        RVar3 = ref_geom_bspline_row(degree,n_control_point,knots,t,N);
        if (RVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x10e4,"ref_geom_bspline_row_tec",1,"eval");
          return 1;
        }
        if (n_control_point != 0) {
          uVar7 = 0;
          do {
            fprintf(__s," %f",N[uVar7]);
            uVar7 = uVar7 + 1;
          } while ((uint)n_control_point != uVar7);
        }
        fputc(10,__s);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0x3e9);
      free(N);
      fclose(__s);
      return 0;
    }
    pcVar6 = "malloc N of REF_DBL NULL";
    uVar4 = 0x10dc;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_bspline_row_tec",pcVar6);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_row_tec(REF_INT degree,
                                            REF_INT n_control_point,
                                            REF_DBL *knots,
                                            const char *filename) {
  REF_INT i, n = 1001, j;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *N;
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine basis\"\n");
  fprintf(file, "variables = \"t\"");
  for (j = 0; j < n_control_point; j++) {
    fprintf(file, " \"N%d,%d\"", j, degree);
  }
  fprintf(file, "\n");
  fprintf(file, "zone t=\"basis\", i=%d, datapacking=%s\n", n, "point");

  ref_malloc(N, n_control_point, REF_DBL);
  t0 = knots[degree];
  t1 = knots[degree + n_control_point - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    fprintf(file, " %f", t);
    RSS(ref_geom_bspline_row(degree, n_control_point, knots, t, N), "eval");
    for (j = 0; j < n_control_point; j++) {
      fprintf(file, " %f", N[j]);
    }
    fprintf(file, "\n");
  }
  ref_free(N);
  fclose(file);
  return REF_SUCCESS;
}